

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O2

void draw_label(yolo_image *im,int row,int col,yolo_image *label,float *rgb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pfVar5;
  pointer pfVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  iVar1 = label->w;
  iVar2 = label->h;
  iVar9 = row - iVar2;
  if (row - iVar2 < 0) {
    iVar9 = row;
  }
  iVar12 = 0;
  if (0 < iVar1) {
    iVar12 = iVar1;
  }
  iVar13 = 0;
  if (0 < iVar2) {
    iVar13 = iVar2;
  }
  iVar3 = im->h;
  iVar10 = 0;
  iVar14 = iVar9;
  for (iVar15 = 0; (iVar15 != iVar13 && (iVar9 + iVar15 < iVar3)); iVar15 = iVar15 + 1) {
    iVar4 = im->w;
    iVar8 = 0;
    uVar7 = label->c;
    if (label->c < 1) {
      uVar7 = 0;
    }
    iVar18 = iVar4 * iVar14 + col;
    iVar16 = iVar10;
    for (; (iVar8 != iVar12 && (col + iVar8 < iVar4)); iVar8 = iVar8 + 1) {
      pfVar5 = (label->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar6 = (im->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = iVar18;
      iVar19 = iVar16;
      for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        pfVar6[iVar17] = pfVar5[iVar19] * rgb[uVar11];
        iVar17 = iVar17 + iVar3 * iVar4;
        iVar19 = iVar19 + iVar2 * iVar1;
      }
      iVar18 = iVar18 + 1;
      iVar16 = iVar16 + 1;
    }
    iVar14 = iVar14 + 1;
    iVar10 = iVar10 + iVar1;
  }
  return;
}

Assistant:

void draw_label(yolo_image & im, int row, int col, const yolo_image & label, const float * rgb)
{
    int w = label.w;
    int h = label.h;
    if (row - h >= 0) {
        row = row - h;
    }
    for (int j = 0; j < h && j + row < im.h; j++) {
        for (int i = 0; i < w && i + col < im.w; i++) {
            for (int k = 0; k < label.c; k++) {
                float val = label.get_pixel(i, j, k);
                im.set_pixel(i + col, j + row, k, rgb[k] * val);
            }
        }
    }
}